

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_ref.cpp
# Opt level: O3

string * __thiscall
duckdb::ColumnDataRef::ToString_abi_cxx11_(string *__return_storage_ptr__,ColumnDataRef *this)

{
  ColumnDataCollection *this_00;
  string result;
  string local_60;
  string local_40;
  
  this_00 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&this->collection);
  ColumnDataCollection::ToString_abi_cxx11_(&local_40,this_00);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  TableRef::BaseToString
            (__return_storage_ptr__,&this->super_TableRef,&local_60,&this->expected_names);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ColumnDataRef::ToString() const {
	auto result = collection->ToString();
	return BaseToString(result, expected_names);
}